

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get.hpp
# Opt level: O2

enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
           (basic_value<toml::type_config> *v)

{
  local_time_type *this;
  nanoseconds nVar1;
  
  this = basic_value<toml::type_config>::as_local_time(v);
  nVar1 = local_time::operator_cast_to_duration(this);
  return (enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )nVar1.__r;
}

Assistant:

cxx::enable_if_t<detail::is_chrono_duration<T>::value, T>
get(const basic_value<TC>& v)
{
    return std::chrono::duration_cast<T>(
            std::chrono::nanoseconds(v.as_local_time()));
}